

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapeSliceLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  bool bVar1;
  uint uVar2;
  LogMessage *pLVar3;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar4;
  runtime_error *prVar5;
  uint uVar6;
  undefined1 *from;
  int iVar7;
  size_t val;
  ShapeRange outrange;
  SliceLayerParams slice;
  ShapeRange size;
  size_t local_198;
  ShapeRange local_190;
  LogMessage local_170;
  SliceLayerParams local_138;
  ShapeRange local_108;
  ShapeRange local_e0;
  ShapeRange local_c0;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_170,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_170,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_170,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_170,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_170);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  pSVar4 = ShapeConstraint::sequenceRange(this_00);
  ShapeConstraint::updateSequenceRange(this_01,pSVar4);
  pSVar4 = ShapeConstraint::batchRange(this_00);
  ShapeConstraint::updateBatchRange(this_01,pSVar4);
  pSVar4 = ShapeConstraint::sequenceRange(this_01);
  ShapeConstraint::updateSequenceRange(this_00,pSVar4);
  pSVar4 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_00,pSVar4);
  if (specLayer->_oneof_case_[0] == 0x15e) {
    from = *(undefined1 **)&specLayer->layer_;
  }
  else {
    from = Specification::_SliceLayerParams_default_instance_;
  }
  Specification::SliceLayerParams::SliceLayerParams(&local_138,(SliceLayerParams *)from);
  uVar6 = (uint)local_138.startindex_;
  iVar7 = (int)local_138.endindex_;
  if ((int)uVar6 < 0 || iVar7 < 1) {
    if (iVar7 < 1 && (int)uVar6 < 0) {
      local_198 = -local_138.startindex_;
      goto LAB_00311e22;
    }
    val = 0;
    local_198 = 0;
    bVar1 = false;
  }
  else {
    local_198 = local_138.endindex_ & 0xffffffff;
LAB_00311e22:
    val = (size_t)((int)(~uVar6 + iVar7) / (int)local_138.stride_ + 1);
    local_198 = local_198 & 0xffffffff;
    bVar1 = true;
  }
  if (bVar1) {
    if (local_138.axis_ == 2) {
      pSVar4 = ShapeConstraint::channelRange(this_00);
      ShapeConstraint::updateChannelRange(this_01,pSVar4);
      pSVar4 = ShapeConstraint::heightRange(this_00);
      ShapeConstraint::updateHeightRange(this_01,pSVar4);
      ShapeConstraint::setWidth(this_01,val);
      pSVar4 = ShapeConstraint::channelRange(this_01);
      ShapeConstraint::updateChannelRange(this_00,pSVar4);
      pSVar4 = ShapeConstraint::heightRange(this_01);
      ShapeConstraint::updateHeightRange(this_00,pSVar4);
      ShapeConstraint::lowerBoundWidth(this_00,local_198);
    }
    else {
      if (local_138.axis_ == 1) {
        pSVar4 = ShapeConstraint::channelRange(this_00);
        ShapeConstraint::updateChannelRange(this_01,pSVar4);
        ShapeConstraint::setHeight(this_01,val);
        pSVar4 = ShapeConstraint::widthRange(this_00);
        ShapeConstraint::updateWidthRange(this_01,pSVar4);
        pSVar4 = ShapeConstraint::channelRange(this_01);
        ShapeConstraint::updateChannelRange(this_00,pSVar4);
        ShapeConstraint::lowerBoundHeight(this_00,local_198);
      }
      else {
        if (local_138.axis_ != 0) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar5,"Slice layer axis incorrect -- should be caught in validator.");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        ShapeConstraint::setChannel(this_01,val);
        pSVar4 = ShapeConstraint::heightRange(this_00);
        ShapeConstraint::updateHeightRange(this_01,pSVar4);
        pSVar4 = ShapeConstraint::widthRange(this_00);
        ShapeConstraint::updateWidthRange(this_01,pSVar4);
        ShapeConstraint::lowerBoundChannel(this_00,local_198);
        pSVar4 = ShapeConstraint::heightRange(this_01);
        ShapeConstraint::updateHeightRange(this_00,pSVar4);
      }
      pSVar4 = ShapeConstraint::widthRange(this_01);
      ShapeConstraint::updateWidthRange(this_00,pSVar4);
    }
  }
  else {
    ShapeRange::ShapeRange(&local_108);
    if (local_138.axis_ == 0) {
      pSVar4 = ShapeConstraint::channelRange(this_00);
    }
    else if (local_138.axis_ == 1) {
      pSVar4 = ShapeConstraint::heightRange(this_00);
    }
    else {
      if (local_138.axis_ != 2) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar5,"Slice layer axis incorrect -- should be caught in validator.");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pSVar4 = ShapeConstraint::widthRange(this_00);
    }
    local_108._minimum._isUnbound = (pSVar4->_minimum)._isUnbound;
    local_108._minimum._1_7_ = *(undefined7 *)&(pSVar4->_minimum).field_0x1;
    local_108._minimum._val = (pSVar4->_minimum)._val;
    local_108._maximum._isUnbound = (pSVar4->_maximum)._isUnbound;
    local_108._maximum._1_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
    local_108._maximum._val = (pSVar4->_maximum)._val;
    uVar2 = -uVar6;
    if (iVar7 < 1) {
      uVar2 = uVar6;
      iVar7 = -iVar7;
    }
    iVar7 = iVar7 + uVar2 + 1;
    ShapeRange::operator-(&local_e0,&local_108,iVar7);
    ShapeRange::operator/(&local_c0,&local_e0,(int)local_138.stride_);
    ShapeRange::operator+(&local_190,&local_c0,1);
    if (local_138.axis_ == 0) {
      ShapeConstraint::updateChannelRange(this_01,&local_190);
      pSVar4 = ShapeConstraint::heightRange(this_00);
      ShapeConstraint::updateHeightRange(this_01,pSVar4);
      pSVar4 = ShapeConstraint::widthRange(this_00);
      ShapeConstraint::updateWidthRange(this_01,pSVar4);
      ShapeConstraint::lowerBoundChannel(this_00,(long)iVar7);
      pSVar4 = ShapeConstraint::heightRange(this_01);
      ShapeConstraint::updateHeightRange(this_00,pSVar4);
    }
    else {
      if (local_138.axis_ != 1) {
        if (local_138.axis_ != 2) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar5,"Slice layer axis incorrect -- should be caught in validator.");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pSVar4 = ShapeConstraint::channelRange(this_00);
        ShapeConstraint::updateChannelRange(this_01,pSVar4);
        pSVar4 = ShapeConstraint::heightRange(this_00);
        ShapeConstraint::updateHeightRange(this_01,pSVar4);
        ShapeConstraint::updateWidthRange(this_01,&local_190);
        pSVar4 = ShapeConstraint::channelRange(this_01);
        ShapeConstraint::updateChannelRange(this_00,pSVar4);
        pSVar4 = ShapeConstraint::heightRange(this_01);
        ShapeConstraint::updateHeightRange(this_00,pSVar4);
        ShapeConstraint::lowerBoundWidth(this_00,(long)iVar7);
        goto LAB_003121ba;
      }
      pSVar4 = ShapeConstraint::channelRange(this_00);
      ShapeConstraint::updateChannelRange(this_01,pSVar4);
      ShapeConstraint::updateHeightRange(this_01,&local_190);
      pSVar4 = ShapeConstraint::widthRange(this_00);
      ShapeConstraint::updateWidthRange(this_01,pSVar4);
      pSVar4 = ShapeConstraint::channelRange(this_01);
      ShapeConstraint::updateChannelRange(this_00,pSVar4);
      ShapeConstraint::lowerBoundHeight(this_00,(long)iVar7);
    }
    pSVar4 = ShapeConstraint::widthRange(this_01);
    ShapeConstraint::updateWidthRange(this_00,pSVar4);
  }
LAB_003121ba:
  Specification::SliceLayerParams::~SliceLayerParams(&local_138);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeSliceLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Slice layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Slice layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(inputShape.sequenceRange());
    outputShape.updateBatchRange(inputShape.batchRange());

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());

    Specification::SliceLayerParams slice = specLayer.slice();
    int start = static_cast<int>(slice.startindex());
    int end = static_cast<int>(slice.endindex());
    int stride = static_cast<int>(slice.stride());
    auto axis = slice.axis();

    int outsize = 0;
    int inLowerBound = 0;
    bool fixedSize = false;

    if (start >= 0 && end > 0) {
        fixedSize = true;
        outsize = (end - 1 - start) / stride + 1;
        inLowerBound = end;
    }
    else if (start < 0 && end <= 0) {
        fixedSize = true;
        inLowerBound = -1*start;
        outsize = (-start - 1 + end) / stride + 1;
    }

    // TODO: add check that this size is possible from the input size

    if (fixedSize) {
        switch (axis) {
            case Specification::SliceLayerParams::CHANNEL_AXIS:
                outputShape.setChannel(static_cast<size_t>(outsize));
                outputShape.updateHeightRange(inputShape.heightRange());
                outputShape.updateWidthRange(inputShape.widthRange());

                inputShape.lowerBoundChannel(static_cast<size_t>(inLowerBound));
                inputShape.updateHeightRange(outputShape.heightRange());
                inputShape.updateWidthRange(outputShape.widthRange());

                break;
            case Specification::SliceLayerParams::HEIGHT_AXIS:
                outputShape.updateChannelRange(inputShape.channelRange());
                outputShape.setHeight(static_cast<size_t>(outsize));
                outputShape.updateWidthRange(inputShape.widthRange());

                inputShape.updateChannelRange(outputShape.channelRange());
                inputShape.lowerBoundHeight(static_cast<size_t>(inLowerBound));
                inputShape.updateWidthRange(outputShape.widthRange());

                break;
            case Specification::SliceLayerParams::WIDTH_AXIS:
                outputShape.updateChannelRange(inputShape.channelRange());
                outputShape.updateHeightRange(inputShape.heightRange());
                outputShape.setWidth(static_cast<size_t>(outsize));

                inputShape.updateChannelRange(outputShape.channelRange());
                inputShape.updateHeightRange(outputShape.heightRange());
                inputShape.lowerBoundWidth(static_cast<size_t>(inLowerBound));

                break;
            default:
                throw std::runtime_error("Slice layer axis incorrect -- should be caught in validator.");
                break;
        }
    }
    else {
        ShapeRange size;
        switch (axis) {
            case Specification::SliceLayerParams::CHANNEL_AXIS:
                size = inputShape.channelRange();
                break;
            case Specification::SliceLayerParams::HEIGHT_AXIS:
                size = inputShape.heightRange();
                break;
            case Specification::SliceLayerParams::WIDTH_AXIS:
                size = inputShape.widthRange();
                break;
            default:
                throw std::runtime_error("Slice layer axis incorrect -- should be caught in validator.");
                break;
        }

        if (end <= 0) {
            end = (-1*end);
        }
        else { // start <=0, we already took the case where they have the same size
            start = (-1*start);
        }

        ShapeRange outrange = (size - (start + 1 + end)) / stride + 1;

        inLowerBound = start + 1 + end;

        switch (axis) {
            case Specification::SliceLayerParams::CHANNEL_AXIS: {
                outputShape.updateChannelRange(outrange);
                outputShape.updateHeightRange(inputShape.heightRange());
                outputShape.updateWidthRange(inputShape.widthRange());

                inputShape.lowerBoundChannel(static_cast<size_t>(inLowerBound));
                inputShape.updateHeightRange(outputShape.heightRange());
                inputShape.updateWidthRange(outputShape.widthRange());

                break;
            }
            case Specification::SliceLayerParams::HEIGHT_AXIS: {
                outputShape.updateChannelRange(inputShape.channelRange());
                outputShape.updateHeightRange(outrange);
                outputShape.updateWidthRange(inputShape.widthRange());

                inputShape.updateChannelRange(outputShape.channelRange());
                inputShape.lowerBoundHeight(static_cast<size_t>(inLowerBound));
                inputShape.updateWidthRange(outputShape.widthRange());

                break;
            }
            case Specification::SliceLayerParams::WIDTH_AXIS: {
                outputShape.updateChannelRange(inputShape.channelRange());
                outputShape.updateHeightRange(inputShape.heightRange());
                outputShape.updateWidthRange(outrange);

                inputShape.updateChannelRange(outputShape.channelRange());
                inputShape.updateHeightRange(outputShape.heightRange());
                inputShape.lowerBoundWidth(static_cast<size_t>(inLowerBound));

                break;
            }
            default: {
                throw std::runtime_error("Slice layer axis incorrect -- should be caught in validator.");
                break;
            }
        }

    } // signs don't match

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Slice layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Slice layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}